

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O2

void __thiscall
TPZBlockDiagonal<std::complex<float>_>::TPZBlockDiagonal
          (TPZBlockDiagonal<std::complex<float>_> *this,TPZBlockDiagonal<std::complex<float>_> *A)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar1 = (*(A->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(A);
  iVar2 = (*(A->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(A);
  TPZMatrix<std::complex<float>_>::TPZMatrix
            (&this->super_TPZMatrix<std::complex<float>_>,&PTR_PTR_01667298,
             CONCAT44(extraout_var,iVar1),CONCAT44(extraout_var_00,iVar2));
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZBlockDiagonal_01667018;
  TPZVec<std::complex<float>_>::TPZVec(&this->fStorage,&A->fStorage);
  TPZVec<long>::TPZVec(&this->fBlockPos,&A->fBlockPos);
  TPZVec<int>::TPZVec(&this->fBlockSize,&A->fBlockSize);
  return;
}

Assistant:

TPZBlockDiagonal<TVar>::TPZBlockDiagonal (const TPZBlockDiagonal<TVar> & A)
: TPZRegisterClassId(&TPZBlockDiagonal::ClassId),
TPZMatrix<TVar>( A.Dim(), A.Dim() ), fStorage(A.fStorage),
fBlockPos(A.fBlockPos), fBlockSize(A.fBlockSize)
{
}